

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  bool bVar3;
  uint64_t uVar4;
  ulong uVar5;
  slot_type *extraout_RDX;
  slot_type *extraout_RDX_00;
  size_t hash;
  slot_type *psVar6;
  undefined8 new_slot;
  ctrl_t cVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t v;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>
  *alloc;
  undefined8 uVar10;
  FindInfo FVar11;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                 );
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = 0;
  local_50.heap.control = (common->heap_or_soo_).heap.control;
  local_50.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  CommonFields::set_capacity(common,new_capacity);
  bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,80ul,false,false,8ul>
                    ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,0x20,0x50);
  uVar10 = local_50.heap.control;
  if (local_40 != 0) {
    alloc = *(allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>
              **)((long)&common->heap_or_soo_ + 8);
    if (bVar3) {
      if (7 < local_40) {
        __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x856,
                      "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                     );
      }
      if ((0x10 < common->capacity_) || (common->capacity_ <= local_40)) {
        __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x858,
                      "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>]"
                     );
      }
      if ((char)local_37 == '\x01') {
LAB_00f35788:
        __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7ea,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      uVar9 = 0;
      psVar6 = extraout_RDX;
      new_slot = local_50.heap.slot_array;
      do {
        alloc = alloc + 0x50;
        if (kSentinel < *(ctrl_t *)(uVar10 + uVar9)) {
          common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
          ::
          transfer<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                    (alloc,(slot_type *)new_slot,psVar6);
          psVar6 = extraout_RDX_00;
        }
        uVar9 = uVar9 + 1;
        new_slot = new_slot + 0x50;
      } while (uVar9 < local_40);
    }
    else {
      if ((char)local_37 == '\x01') goto LAB_00f35788;
      if (local_40 != 0) {
        uVar9 = 0;
        uVar10 = local_50.heap.slot_array;
        do {
          if ((char)local_37 == '\x01') {
            __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7e6,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (kSentinel < local_50.heap.control[uVar9]) {
            uVar1 = *(size_type *)(uVar10 + 8);
            uVar4 = hash_internal::MixingHashState::CombineContiguousImpl
                              (&hash_internal::MixingHashState::kSeed,*(undefined8 *)uVar10,uVar1);
            uVar8 = (uVar4 ^ uVar1) * -0x234dd359734ecb13;
            FVar11 = find_first_non_full<void>
                               ((container_internal *)common,
                                (CommonFields *)
                                (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                                 (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                                 (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                                 (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38),hash);
            uVar5 = FVar11.offset;
            uVar1 = common->capacity_;
            if (uVar1 <= uVar5) {
              __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x744,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar7 = (ctrl_t)(uVar8 >> 0x38) & ~kEmpty;
            pcVar2 = (common->heap_or_soo_).heap.control;
            pcVar2[uVar5] = cVar7;
            psVar6 = (slot_type *)(pcVar2 + (uVar5 - 0xf & uVar1));
            *(ctrl_t *)((ulong)((uint)uVar1 & 0xf) + (long)psVar6) = cVar7;
            common->capacity_ = 0xffffffffffffff9c;
            common_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
            ::
            transfer<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                      (alloc + uVar5 * 0x50,(slot_type *)uVar10,psVar6);
            CommonFields::set_capacity(common,uVar1);
          }
          uVar9 = uVar9 + 1;
          uVar10 = uVar10 + 0x50;
        } while (uVar9 != local_40);
      }
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
    }
    HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
              ((HashSetResizeHelper *)&local_50,&local_52,0x50);
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }